

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  signal(10,signal_handler);
  signal(0xb,signal_handler);
  run("../main.pie");
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  signal(SIGUSR1, signal_handler);
  signal(SIGSEGV, signal_handler);

#if TEST_MODE
  run("../main.pie");
#else
  if (argc == 2) {
    run(argv[1]);
  }
  else {
    run_repl();
  }
#endif

  return 0;
}